

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void __thiscall Apt::PostProcessPaths(Apt *this)

{
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  const_iterator lat1;
  _List_const_iterator<TaxiTmpPos> dontCombineWith;
  reference this_00;
  reference this_01;
  size_t sVar4;
  int __x;
  double in_RDI;
  double dVar5;
  double extraout_XMM0_Qa;
  double bcAngle;
  TaxiTmpPos *c;
  TaxiTmpPos *b;
  const_iterator iEnd;
  int numSkipped;
  double firstAngle;
  size_t idxA_First;
  size_t idxB;
  size_t idxA;
  TaxiTmpPath *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  listTaxiTmpPathTy *__range1_1;
  size_t firstNonJoint;
  pair<const_double,_TaxiTmpPos> *p;
  iterator __end1;
  iterator __begin1;
  mapTaxiTmpPosTy *__range1;
  _List_const_iterator<TaxiTmpPos> in_stack_fffffffffffffef8;
  list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_> *in_stack_ffffffffffffff00;
  value_type_conflict2 *in_stack_ffffffffffffff08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  Apt *in_stack_ffffffffffffff28;
  edgeTy _type;
  double in_stack_ffffffffffffff38;
  Apt *in_stack_ffffffffffffff48;
  _Self _lon;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  Apt *this_02;
  size_t local_60;
  size_t local_58;
  _Self local_48;
  _Self local_40;
  listTaxiTmpPathTy *local_38;
  size_type local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  mapTaxiTmpPosTy *local_10;
  
  local_10 = &mapPos;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<double,_TaxiTmpPos,_std::less<double>,_std::allocator<std::pair<const_double,_TaxiTmpPos>_>_>
       ::begin((map<double,_TaxiTmpPos,_std::less<double>,_std::allocator<std::pair<const_double,_TaxiTmpPos>_>_>
                *)in_stack_fffffffffffffef8._M_node);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<double,_TaxiTmpPos,_std::less<double>,_std::allocator<std::pair<const_double,_TaxiTmpPos>_>_>
       ::end((map<double,_TaxiTmpPos,_std::less<double>,_std::allocator<std::pair<const_double,_TaxiTmpPos>_>_>
              *)in_stack_fffffffffffffef8._M_node);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::_Rb_tree_iterator<std::pair<const_double,_TaxiTmpPos>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_double,_TaxiTmpPos>_> *)0x1a683e);
    bVar1 = TaxiTmpPos::isJoint(&local_28->second);
    if (bVar1) {
      in_stack_ffffffffffffff38 = TaxiTmpPos::lat(&local_28->second);
      TaxiTmpPos::lon(&local_28->second);
      AddTaxiNode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                  (size_t)in_stack_ffffffffffffff10,
                  SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    }
    std::_Rb_tree_iterator<std::pair<const_double,_TaxiTmpPos>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_TaxiTmpPos>_> *)in_stack_ffffffffffffff00)
    ;
  }
  local_30 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::size
                       ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)((long)in_RDI + 0xb8));
  local_38 = &listPaths_abi_cxx11_;
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>::begin
                 (in_stack_fffffffffffffef8._M_node);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>::end
                 (in_stack_fffffffffffffef8._M_node);
  do {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) {
      return;
    }
    std::_List_iterator<TaxiTmpPath>::operator*((_List_iterator<TaxiTmpPath> *)0x1a6930);
    pvVar3 = std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::front
                       (in_stack_ffffffffffffff00);
    dVar5 = TaxiTmpPos::lat(pvVar3);
    pvVar3 = std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::front
                       (in_stack_ffffffffffffff00);
    TaxiTmpPos::lon(pvVar3);
    local_58 = AddTaxiNode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                           SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    this_02 = (Apt *)0x7ff8000000000000;
    iVar6 = 0;
    lat1 = std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::cbegin
                     (in_stack_fffffffffffffef8._M_node);
    while( true ) {
      std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::cend
                ((list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_> *)in_stack_fffffffffffffef8._M_node)
      ;
      dontCombineWith =
           std::prev<std::_List_const_iterator<TaxiTmpPos>>(in_stack_fffffffffffffef8,0x1a6a15);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff80,(_Self *)&stack0xffffffffffffff78);
      _type = (edgeTy)((ulong)dVar5 >> 0x20);
      if (!bVar1) break;
      this_00 = std::_List_const_iterator<TaxiTmpPos>::operator*
                          ((_List_const_iterator<TaxiTmpPos> *)in_stack_ffffffffffffff00);
      _lon._M_node = lat1._M_node;
      std::next<std::_List_const_iterator<TaxiTmpPos>>(in_stack_fffffffffffffef8,0x1a6a69);
      this_01 = std::_List_const_iterator<TaxiTmpPos>::operator*
                          ((_List_const_iterator<TaxiTmpPos> *)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff28 = (Apt *)TaxiTmpPos::lat(this_00);
      in_stack_ffffffffffffff18 = TaxiTmpPos::lon(this_00);
      in_stack_ffffffffffffff20 = TaxiTmpPos::lat(this_01);
      TaxiTmpPos::lon(this_01);
      in_stack_ffffffffffffff48 =
           (Apt *)CoordAngle((double)lat1._M_node,(double)in_stack_ffffffffffffff48,in_RDI,
                             in_stack_ffffffffffffff38);
      uVar2 = std::isnan((double)this_02);
      if ((uVar2 & 1) == 0) {
        in_stack_ffffffffffffff10 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)TaxiTmpPos::lat(this_00);
        TaxiTmpPos::lon(this_00);
        __x = SUB84(in_RDI,0);
        local_60 = GetSimilarTaxiNode(this_02,(double)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                                      (double)_lon._M_node,(size_t)dontCombineWith._M_node);
        if ((local_30 <= local_60) && (iVar6 < 4)) {
          HeadingDiff(in_stack_ffffffffffffff18,(double)in_stack_ffffffffffffff10);
          std::abs(__x);
          if (extraout_XMM0_Qa <= 15.0) {
            iVar6 = iVar6 + 1;
            goto LAB_001a6c46;
          }
        }
        if (local_60 == 0xffffffffffffffff) {
          in_stack_ffffffffffffff08 = (value_type_conflict2 *)TaxiTmpPos::lat(this_00);
          TaxiTmpPos::lon(this_00);
          local_60 = AddTaxiNode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                                 SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
        }
        if (local_58 != local_60) {
          AddTaxiEdge(in_stack_ffffffffffffff48,(size_t)in_RDI,(size_t)in_stack_ffffffffffffff38,
                      (edgeTy)((ulong)dVar5 >> 0x20));
          local_58 = local_60;
          iVar6 = 0;
          this_02 = in_stack_ffffffffffffff48;
        }
      }
      else {
        iVar6 = 0;
        this_02 = in_stack_ffffffffffffff48;
      }
LAB_001a6c46:
      std::_List_const_iterator<TaxiTmpPos>::operator++
                ((_List_const_iterator<TaxiTmpPos> *)&stack0xffffffffffffff80);
      lat1._M_node = _lon._M_node;
    }
    pvVar3 = std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::back
                       (in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff00 =
         (list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_> *)TaxiTmpPos::lat(pvVar3);
    pvVar3 = std::__cxx11::list<TaxiTmpPos,_std::allocator<TaxiTmpPos>_>::back
                       (in_stack_ffffffffffffff00);
    TaxiTmpPos::lon(pvVar3);
    sVar4 = AddTaxiNode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                        SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    if (local_58 != sVar4) {
      AddTaxiEdge(in_stack_ffffffffffffff48,(size_t)in_RDI,(size_t)in_stack_ffffffffffffff38,_type);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    std::_List_iterator<TaxiTmpPath>::operator++(&local_40);
  } while( true );
}

Assistant:

void PostProcessPaths ()
    {
        // -- 1. Identify joints and add them upfront to our network
        for (const auto& p: mapPos)
            if (p.second.isJoint())
                AddTaxiNode(p.second.lat(), p.second.lon(), ULONG_MAX, false);
        // all joints added, so up to here it is all full of joints:
        const size_t firstNonJoint = vecTaxiNodes.size();

        // -- 2. Process the edges, thereby adding more nodes
        for (const TaxiTmpPath& p: listPaths)
        {
            // The indexes to be used when adding the edge.
            // idxA points to the (already added) first node,
            // idxB to the just now added second node
            size_t idxA=ULONG_MAX, idxB=ULONG_MAX;
            
            // The first node of the entire list is definitely used, add it already
            const size_t idxA_First =
            idxA = AddTaxiNode(p.listPos.front().lat(),
                               p.listPos.front().lon());
            // Remember this node as one of the path's endpoint
            vecPathEnds.push_back(idxA);
            
            // The very last node will also be added later.
            // Between these two:
            // Combine adges til
            // a) reaching a joint, or
            // b) heading changes too much.
            // Add the remainder to the airport's taxi network
            double firstAngle = NAN;
            int numSkipped = 0;                         // number of skipped nodes in a row
            for (auto iEnd = p.listPos.cbegin();
                 iEnd != std::prev(p.listPos.cend());
                 ++iEnd)
            {
                const TaxiTmpPos& b = *iEnd;            // last node that is confirmed to be part of the edge
                const TaxiTmpPos& c = *std::next(iEnd); // next node, to be validated if still in the edge
                double bcAngle = CoordAngle(b.lat(), b.lon(), c.lat(), c.lon());
                if (std::isnan(firstAngle)) {           // new edge has just started, this is our reference angle
                    firstAngle = bcAngle;
                    numSkipped = 0;
                }
                else
                {
                    // is b a joint?
                    idxB = GetSimilarTaxiNode(b.lat(), b.lon());
                    if (idxB < firstNonJoint ||
                        // so many nodes...there's a reason for them, isn't it?
                        numSkipped >= 4 ||
                        // or has heading changed too much?
                        std::abs(HeadingDiff(firstAngle, bcAngle)) > APT_MAX_TAXI_SEGM_TURN)
                    {
                        // Add the edge to this node
                        if (idxB == ULONG_MAX)
                            idxB = AddTaxiNode(b.lat(), b.lon(), ULONG_MAX, false);
                        if (idxA != idxB) {
                            AddTaxiEdge(idxA, idxB);
                            // start a new edge, first segment will be b-c
                            idxA = idxB;
                            firstAngle = bcAngle;
                            numSkipped = 0;
                        }
                    }
                    else
                        ++numSkipped;
                }
            }
            
            // The last node of the list is also always to be added
            idxB = AddTaxiNode(p.listPos.back().lat(),
                               p.listPos.back().lon(),
                               idxA_First);     // never combine with very first node; this ensures that at least one edge will be added!
            if (idxA != idxB) {
                AddTaxiEdge(idxA, idxB);
                // Remember this node as the path's other endpoint
                vecPathEnds.push_back(idxB);
            }
        }
    }